

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBucket::ConstructFreelist(LargeHeapBucket *this,LargeHeapBlock *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  
  if (heapBlock->hasPartialFreeObjects == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f1,"(!heapBlock->hasPartialFreeObjects)",
                       "!heapBlock->hasPartialFreeObjects");
    if (!bVar2) goto LAB_006efaac;
    *puVar3 = 0;
  }
  if (heapBlock->isInPendingDisposeList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f2,"(!heapBlock->IsInPendingDisposeList())",
                       "!heapBlock->IsInPendingDisposeList()");
    if (!bVar2) {
LAB_006efaac:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((heapBlock->freeList).entries != (LargeHeapBlockFreeListEntry *)0x0) {
    RegisterFreeList(this,&heapBlock->freeList);
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    if (pRVar4->recyclerFlagsTable->Verbose == true) {
      pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
      bVar2 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MemoryAllocationPhase);
      if (!bVar2) {
        pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
        bVar2 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase)
        ;
        if (!bVar2) goto LAB_006efa97;
      }
      Output::Print(L"Free list created for 0x%x bucket\n",(ulong)(this->super_HeapBucket).sizeCat);
    }
  }
LAB_006efa97:
  ReinsertLargeHeapBlock(this,heapBlock);
  return;
}

Assistant:

void
LargeHeapBucket::ConstructFreelist(LargeHeapBlock * heapBlock)
{
    Assert(!heapBlock->hasPartialFreeObjects);
    Assert(!heapBlock->IsInPendingDisposeList());

    // The free list is the only way we reuse heap block entries
    // so if the heap block is allocated from directly, it'll not
    // invalidate the free list
    LargeHeapBlockFreeList* freeList = heapBlock->GetFreeList();
    Assert(freeList);

    if (freeList->entries)
    {
        this->RegisterFreeList(freeList);

#if DBG
        LargeAllocationVerboseTrace(this->GetRecycler()->GetRecyclerFlagsTable(), _u("Free list created for 0x%x bucket\n"), this->sizeCat);
#endif
    }

    ReinsertLargeHeapBlock(heapBlock);
}